

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O2

void OnDiskIndex::on_disk_merge
               (path *db_base,string *fname,IndexType merge_type,
               vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *indexes,TaskSpec *task)

{
  pointer pIVar1;
  long lVar2;
  runtime_error *this;
  long lVar3;
  OnDiskIndex *pOVar4;
  pointer pIVar5;
  RawFile out;
  string local_c8;
  OnDiskIndexHeader header;
  path local_68;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_68,fname);
  std::experimental::filesystem::v1::__cxx11::operator/((path *)&header,db_base,&local_68);
  std::__cxx11::string::string((string *)&local_c8,(string *)&header);
  RawFile::RawFile(&out,&local_c8,0xc1,0x180);
  std::__cxx11::string::~string((string *)&local_c8);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&header);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_68);
  pIVar5 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pIVar1 - (long)pIVar5;
  for (lVar2 = lVar3 / 0x28 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    pOVar4 = pIVar5->index;
    if (pOVar4->ntype != merge_type) goto LAB_00148339;
    pOVar4 = pIVar5[1].index;
    if (pOVar4->ntype != merge_type) {
      pIVar5 = pIVar5 + 1;
      goto LAB_00148339;
    }
    pOVar4 = pIVar5[2].index;
    if (pOVar4->ntype != merge_type) {
      pIVar5 = pIVar5 + 2;
      goto LAB_00148339;
    }
    pOVar4 = pIVar5[3].index;
    if (pOVar4->ntype != merge_type) {
      pIVar5 = pIVar5 + 3;
      goto LAB_00148339;
    }
    pIVar5 = pIVar5 + 4;
    lVar3 = lVar3 + -0xa0;
  }
  lVar2 = lVar3 / 0x28;
  pOVar4 = (OnDiskIndex *)(lVar3 % 0x28);
  if (lVar2 == 1) {
LAB_0014831d:
    if (pIVar5->index->ntype == merge_type) {
      pIVar5 = pIVar1;
    }
  }
  else if (lVar2 == 2) {
LAB_00148311:
    if (pIVar5->index->ntype == merge_type) {
      pIVar5 = pIVar5 + 1;
      goto LAB_0014831d;
    }
  }
  else {
    if (lVar2 != 3) goto LAB_0014833e;
    if (pIVar5->index->ntype == merge_type) {
      pIVar5 = pIVar5 + 1;
      goto LAB_00148311;
    }
  }
LAB_00148339:
  if (pIVar5 != pIVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10,pIVar5,pOVar4);
    std::runtime_error::runtime_error(this,"Unexpected index type during merge");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0014833e:
  header.magic = 0xca7da7a;
  header.version = 6;
  header.reserved = 0;
  header.raw_type = merge_type;
  RawFile::write<unsigned_char>(&out,(uchar *)&header,0x10);
  on_disk_merge_core(indexes,&out,task);
  RawFile::~RawFile(&out);
  return;
}

Assistant:

void OnDiskIndex::on_disk_merge(const fs::path &db_base,
                                const std::string &fname, IndexType merge_type,
                                const std::vector<IndexMergeHelper> &indexes,
                                TaskSpec *task) {
    RawFile out(db_base / fname, O_WRONLY | O_CREAT | O_EXCL, 0600);

    if (!std::all_of(indexes.begin(), indexes.end(),
                     [merge_type](const IndexMergeHelper &ndx) {
                         return ndx.index->ntype == merge_type;
                     })) {
        throw std::runtime_error("Unexpected index type during merge");
    }

    OnDiskIndexHeader header;
    header.magic = DB_MAGIC;
    header.version = OnDiskIndex::VERSION;
    header.raw_type = static_cast<uint32_t>(merge_type);
    header.reserved = 0;

    out.write(reinterpret_cast<uint8_t *>(&header), sizeof(header));

    on_disk_merge_core(indexes, &out, task);
}